

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O2

void smoke_test(void)

{
  undefined1 __p [8];
  undefined8 uVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  unique_ptr<argo::json,_std::default_delete<argo::json>_> j2;
  unique_ptr<argo::json,_std::default_delete<argo::json>_> j1;
  allocator local_51;
  undefined1 local_50 [8];
  undefined1 local_48 [40];
  
  std::__cxx11::string::string
            ((string *)(local_48 + 8),"test_files/test2.json",(allocator *)local_50);
  argo::parser::load((parser *)local_48,(string *)(local_48 + 8));
  std::__cxx11::string::~string((string *)(local_48 + 8));
  uVar1 = local_48._0_8_;
  std::__cxx11::string::string((string *)(local_48 + 8),"test_files/tmp.json",(allocator *)local_50)
  ;
  argo::unparser::save((json *)uVar1,(string *)(local_48 + 8)," ",""," ",0);
  std::__cxx11::string::~string((string *)(local_48 + 8));
  std::__cxx11::string::string((string *)(local_48 + 8),"test_files/test2.json",&local_51);
  argo::parser::load((parser *)local_50,(string *)(local_48 + 8));
  std::__cxx11::string::~string((string *)(local_48 + 8));
  bVar2 = argo::json::operator==((json *)local_48._0_8_,(json *)local_50);
  pcVar3 = "FAIL: load and dump and load again produced unequal results\n";
  pcVar4 = "FAIL: load and dump and load again produced unequal results\n";
  if (bVar2) {
    pcVar4 = "PASS: load and dump and load again produced equal results\n";
  }
  std::operator<<((ostream *)jlog,pcVar4);
  std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr
            ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)local_50);
  std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr
            ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)local_48);
  std::__cxx11::string::string
            ((string *)(local_48 + 8),"test_files/test2.json",(allocator *)local_50);
  argo::parser::load((parser *)local_48,(string *)(local_48 + 8));
  std::__cxx11::string::~string((string *)(local_48 + 8));
  uVar1 = local_48._0_8_;
  std::__cxx11::string::string((string *)(local_48 + 8),"test_files/tmp.json",(allocator *)local_50)
  ;
  argo::unparser::save((json *)uVar1,(string *)(local_48 + 8)," ",""," ",0);
  std::__cxx11::string::~string((string *)(local_48 + 8));
  std::__cxx11::string::string((string *)(local_48 + 8),"test_files/tmp.json",&local_51);
  argo::parser::load((parser *)local_50,(string *)(local_48 + 8));
  __p = local_50;
  local_50 = (undefined1  [8])0x0;
  std::__uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>::reset
            ((__uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_> *)local_48,(pointer)__p)
  ;
  std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr
            ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)local_50);
  std::__cxx11::string::~string((string *)(local_48 + 8));
  uVar1 = local_48._0_8_;
  std::__cxx11::string::string((string *)(local_48 + 8),"test_files/tmp.json",(allocator *)local_50)
  ;
  argo::unparser::save((json *)uVar1,(string *)(local_48 + 8)," ",""," ",0);
  std::__cxx11::string::~string((string *)(local_48 + 8));
  std::__cxx11::string::string((string *)(local_48 + 8),"test_files/tmp.json",&local_51);
  argo::parser::load((parser *)local_50,(string *)(local_48 + 8));
  std::__cxx11::string::~string((string *)(local_48 + 8));
  bVar2 = argo::json::operator==((json *)local_48._0_8_,(json *)local_50);
  if (bVar2) {
    pcVar3 = "PASS: load and dump and load again produced equal results\n";
  }
  std::operator<<((ostream *)jlog,pcVar3);
  std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr
            ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)local_50);
  std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr
            ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)local_48);
  return;
}

Assistant:

void smoke_test()
{
    {
        auto j1 = parser::load("test_files/test2.json");
        unparser::save(*j1, "test_files/tmp.json");
        auto j2 = parser::load("test_files/test2.json");
        if (*j1 == *j2)
        {
            jlog << "PASS: load and dump and load again produced equal results\n";
        }
        else
        {
            jlog << "FAIL: load and dump and load again produced unequal results\n";
        }
    }

    // now with conversions and an extre dump/load cycle to get everything into the same state
    {
        auto j1 = parser::load("test_files/test2.json");
        unparser::save(*j1, "test_files/tmp.json");

        j1 = parser::load("test_files/tmp.json");
        unparser::save(*j1, "test_files/tmp.json");

        auto j2 = parser::load("test_files/tmp.json");

        if (*j1 == *j2)
        {
            jlog << "PASS: load and dump and load again produced equal results\n";
        }
        else
        {
            jlog << "FAIL: load and dump and load again produced unequal results\n";
        }
    }
}